

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
::
MatchAndExplain<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
          (ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>
           *this,vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                 *lhs,MatchResultListener *listener)

{
  internal_fixup *__last1;
  ostream *os;
  bool bVar1;
  __normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>
  _Var2;
  long lVar3;
  char *pcVar4;
  pointer elem;
  char *pcVar5;
  internal_fixup *piVar6;
  
  piVar6 = (lhs->
           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last1 = (lhs->
            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)__last1 - (long)piVar6 == *(long *)(this + 8) - (long)*(internal_fixup **)this) &&
     (bVar1 = std::__equal<false>::
              equal<pstore::repo::internal_fixup_const*,pstore::repo::internal_fixup_const*>
                        (piVar6,__last1,*(internal_fixup **)this), bVar1)) {
    return true;
  }
  os = listener->stream_;
  if (os != (ostream *)0x0) {
    elem = (lhs->
           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (elem == (lhs->
                super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = "which";
    }
    else {
      bVar1 = false;
      do {
        _Var2 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::repo::internal_fixup>
                          (*(internal_fixup **)this,*(internal_fixup **)(this + 8),elem);
        if (_Var2._M_current == *(internal_fixup **)(this + 8)) {
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar1 = true;
          }
          pstore::repo::operator<<(os,elem);
        }
        elem = elem + 1;
      } while (elem != (lhs->
                       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
      pcVar5 = "which";
      if (bVar1) {
        pcVar5 = ",\nand";
      }
    }
    piVar6 = *(internal_fixup **)this;
    if (piVar6 != *(internal_fixup **)(this + 8)) {
      bVar1 = false;
      do {
        _Var2 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,pstore::repo::internal_fixup>
                          ((lhs->
                           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (lhs->
                           super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                           )._M_impl.super__Vector_impl_data._M_finish,piVar6);
        if (_Var2._M_current ==
            (lhs->
            super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar1) {
            lVar3 = 2;
            pcVar4 = ", ";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,5);
            lVar3 = 0x27;
            pcVar4 = " doesn\'t have these expected elements: ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
          pstore::repo::operator<<(os,piVar6);
          bVar1 = true;
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != *(internal_fixup **)(this + 8));
    }
  }
  return false;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }